

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O0

set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
* __thiscall
CsSignal::SlotBase::internal_senderList
          (set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
           *__return_storage_ptr__,SlotBase *this)

{
  bool bVar1;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *this_00;
  SignalBase *local_78;
  SignalBase **local_70;
  SignalBase **sender;
  const_iterator cStack_60;
  end_iterator __end1;
  const_iterator __begin1;
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *__range1;
  undefined1 local_40 [8];
  read_handle receiverListHandle;
  SlotBase *this_local;
  set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
  *retval;
  
  receiverListHandle._31_1_ = 0;
  std::
  set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
  ::set(__return_storage_ptr__);
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::lock_read((read_handle *)local_40,&this->m_possibleSenders);
  this_00 = libguarded::
            rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
            ::read_handle::operator*((read_handle *)local_40);
  cStack_60 = libguarded::
              rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              ::begin(this_00);
  libguarded::
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  ::end(this_00);
  while( true ) {
    bVar1 = libguarded::
            rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
            ::const_iterator::operator!=
                      (&stack0xffffffffffffffa0,(end_iterator *)((long)&sender + 7));
    if (!bVar1) break;
    local_70 = libguarded::
               rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
               ::const_iterator::operator*(&stack0xffffffffffffffa0);
    local_78 = *local_70;
    std::
    set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
    ::insert(__return_storage_ptr__,&local_78);
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::const_iterator::operator++(&stack0xffffffffffffffa0);
  }
  receiverListHandle._31_1_ = 1;
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::read_handle::~read_handle((read_handle *)local_40);
  if ((receiverListHandle._31_1_ & 1) == 0) {
    std::
    set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
    ::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SignalBase *> CsSignal::SlotBase::internal_senderList() const
{
   std::set<SignalBase *> retval;

   auto receiverListHandle = m_possibleSenders.lock_read();

   for (auto &sender : *receiverListHandle) {
      retval.insert(const_cast<SignalBase *>(sender));
   }

   return retval;
}